

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void __thiscall
Wrapper<ChronoFormatter<unsigned_int,true>,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>&>
::Unserialize<ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>>
          (Wrapper<ChronoFormatter<unsigned_int,_true>,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_&>
           *this,ParamsStream<HashVerifier<AutoFile>_&,_CAddress::SerParams> *s)

{
  long lVar1;
  ParamsStream<HashVerifier<AutoFile>_&,_CAddress::SerParams> *in_RSI;
  ChronoFormatter<unsigned_int,_true> *in_RDI;
  long in_FS_OFFSET;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
  *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ChronoFormatter<unsigned_int,true>::
  Unser<ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>
            (in_RDI,in_RSI,in_stack_ffffffffffffffd8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream &s) const { Formatter().Ser(s, m_object); }